

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall kj::Array<int>::~Array(Array<int> *this)

{
  int *piVar1;
  size_t sVar2;
  
  piVar1 = this->ptr;
  if (piVar1 != (int *)0x0) {
    sVar2 = this->size_;
    this->ptr = (int *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)(this->disposer,piVar1,4,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }